

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O0

QString * __thiscall
QSqlDriver::sqlStatement
          (QSqlDriver *this,StatementType type,QString *tableName,QSqlRecord *rec,
          bool preparedStatement)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QLatin1String *pQVar4;
  ulong uVar5;
  QChar *pQVar6;
  QString *pQVar7;
  QChar *pQVar8;
  undefined4 in_EDX;
  long *in_RSI;
  QString *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar9;
  QLatin1StringView QVar10;
  qsizetype i_3;
  qsizetype i_2;
  qsizetype i_1;
  qsizetype i;
  QString *s;
  QString vals;
  QString tableNamePrefix;
  QString tableNameString;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
  *in_stack_fffffffffffffa48;
  QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String> *in_stack_fffffffffffffa50
  ;
  QString *in_stack_fffffffffffffa58;
  QSqlDriver *driver;
  QString *in_stack_fffffffffffffa60;
  IdentifierType type_00;
  QString *in_stack_fffffffffffffa68;
  QString *identifier;
  qsizetype in_stack_fffffffffffffa78;
  long lVar11;
  QSqlDriver *local_520;
  QString *local_4f8;
  long local_4b0;
  long local_490;
  QChar local_454;
  QChar local_452;
  undefined1 local_450 [30];
  QChar local_432 [25];
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  QLatin1StringView local_3e8;
  QLatin1StringView local_3d8;
  QLatin1StringView local_348;
  undefined1 local_2e8 [28];
  QChar local_2cc;
  QChar local_2ca [25];
  QLatin1StringView local_298;
  QLatin1StringView local_288;
  undefined1 local_1f8 [72];
  QString *local_1b0;
  char16_t local_1a8;
  undefined2 local_19a;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  QLatin1StringView local_180;
  QLatin1StringView local_170;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  QString *local_90;
  char16_t local_88;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  bVar2 = QString::isEmpty((QString *)0x12d253);
  if (bVar2) {
    QString::QString((QString *)0x12d266);
  }
  else {
    prepareIdentifier(in_stack_fffffffffffffa68,
                      (IdentifierType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                      (QSqlDriver *)in_stack_fffffffffffffa58);
  }
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x12d2b1);
  QString::reserve(in_stack_fffffffffffffa60,in_stack_fffffffffffffa78);
  switch(in_EDX) {
  case 0:
    local_198 = 0xaaaaaaaaaaaaaaaa;
    local_190 = 0xaaaaaaaaaaaaaaaa;
    local_188 = 0xaaaaaaaaaaaaaaaa;
    bVar2 = QString::isEmpty((QString *)0x12d54d);
    if (bVar2) {
      QString::QString((QString *)0x12d560);
    }
    else {
      local_19a = 0x2e;
      QVar9 = ::operator+(in_stack_fffffffffffffa58,(char16_t *)in_stack_fffffffffffffa50);
      local_1b0 = QVar9.a;
      local_1a8 = QVar9.b;
      local_90 = local_1b0;
      local_88 = local_1a8;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffa48);
    }
    local_4b0 = 0;
    while (lVar11 = local_4b0, iVar3 = QSqlRecord::count((QSqlRecord *)0x12d5ec), lVar11 < iVar3) {
      bVar2 = QSqlRecord::isGenerated
                        ((QSqlRecord *)in_stack_fffffffffffffa50,
                         (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      if (bVar2) {
        bVar2 = QString::isEmpty((QString *)0x12d629);
        if (bVar2) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
        }
        QString::append((QLatin1String *)in_RDI);
        QString::append((QString *)in_RDI);
        QSqlRecord::fieldName
                  ((QSqlRecord *)in_stack_fffffffffffffa68,
                   (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        prepareIdentifier(in_stack_fffffffffffffa68,
                          (IdentifierType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                          (QSqlDriver *)in_stack_fffffffffffffa58);
        QString::append((QString *)in_RDI);
        QString::~QString((QString *)0x12d6f9);
        QString::~QString((QString *)0x12d706);
        bVar2 = QSqlRecord::isNull((QSqlRecord *)in_stack_fffffffffffffa50,
                                   (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
        if (bVar2) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
          QString::append((QLatin1String *)in_RDI);
        }
        else if (bVar1 == 0) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
          pQVar7 = (QString *)QString::append((QLatin1String *)in_RDI);
          QSqlRecord::field((QSqlRecord *)in_stack_fffffffffffffa58,
                            (int)((ulong)in_stack_fffffffffffffa50 >> 0x20));
          (**(code **)(*in_RSI + 0x98))(local_1f8,in_RSI,local_30,0);
          QString::append(pQVar7);
          QString::~QString((QString *)0x12d84b);
          QSqlField::~QSqlField((QSqlField *)in_stack_fffffffffffffa50);
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
          QString::append((QLatin1String *)in_RDI);
        }
      }
      local_4b0 = local_4b0 + 1;
    }
    QString::~QString((QString *)0x12d88d);
    break;
  case 1:
    for (local_490 = 0; iVar3 = QSqlRecord::count((QSqlRecord *)0x12d312), local_490 < iVar3;
        local_490 = local_490 + 1) {
      bVar2 = QSqlRecord::isGenerated
                        ((QSqlRecord *)in_stack_fffffffffffffa50,
                         (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      if (bVar2) {
        QSqlRecord::fieldName
                  ((QSqlRecord *)in_stack_fffffffffffffa68,
                   (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        prepareIdentifier(in_stack_fffffffffffffa68,
                          (IdentifierType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                          (QSqlDriver *)in_stack_fffffffffffffa58);
        pQVar4 = (QLatin1String *)QString::append((QString *)in_RDI);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
        QString::append(pQVar4);
        QString::~QString((QString *)0x12d3df);
        QString::~QString((QString *)0x12d3ec);
      }
    }
    bVar2 = QString::isEmpty((QString *)0x12d411);
    if (!bVar2) {
      QString::chop((longlong)in_RDI);
      local_170 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
      ::operator+((QLatin1String *)in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
      local_180 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
      ::operator+(&in_stack_fffffffffffffa50->a,(QLatin1String *)in_stack_fffffffffffffa48);
      ::operator+(in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_const_QString_&>
                  *)in_stack_fffffffffffffa48);
      QString::operator=((QString *)in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
      QString::~QString((QString *)0x12d50e);
    }
    break;
  case 2:
    local_288 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QString *)in_stack_fffffffffffffa50,(QLatin1String *)in_stack_fffffffffffffa48);
    ::operator+((QStringBuilder<QString_&,_QLatin1String> *)in_stack_fffffffffffffa50,
                (QString *)in_stack_fffffffffffffa48);
    local_298 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&> *)
                in_stack_fffffffffffffa50,(QLatin1String *)in_stack_fffffffffffffa48);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffa48);
    QString::operator=((QString *)in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
    QString::~QString((QString *)0x12d95c);
    local_4f8 = (QString *)0x0;
    while (identifier = local_4f8, iVar3 = QSqlRecord::count((QSqlRecord *)0x12d982),
          (long)identifier < (long)iVar3) {
      bVar2 = QSqlRecord::isGenerated
                        ((QSqlRecord *)in_stack_fffffffffffffa50,
                         (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      type_00 = (IdentifierType)((ulong)in_stack_fffffffffffffa60 >> 0x20);
      if (bVar2) {
        QSqlRecord::fieldName((QSqlRecord *)identifier,type_00);
        prepareIdentifier(identifier,type_00,(QSqlDriver *)in_stack_fffffffffffffa58);
        in_stack_fffffffffffffa60 = (QString *)QString::append((QString *)in_RDI);
        QChar::QChar<char16_t,_true>(local_2ca,L'=');
        QString::append((QChar *)in_stack_fffffffffffffa60);
        QString::~QString((QString *)0x12da38);
        QString::~QString((QString *)0x12da45);
        if (bVar1 == 0) {
          QSqlRecord::field((QSqlRecord *)in_stack_fffffffffffffa58,
                            (int)((ulong)in_stack_fffffffffffffa50 >> 0x20));
          (**(code **)(*in_RSI + 0x98))(local_2e8,in_RSI,local_58,0);
          QString::append((QString *)in_RDI);
          QString::~QString((QString *)0x12dad3);
          QSqlField::~QSqlField((QSqlField *)in_stack_fffffffffffffa50);
        }
        else {
          QChar::QChar<char16_t,_true>(&local_2cc,L'?');
          QString::append((QChar *)in_RDI);
        }
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
        QString::append((QLatin1String *)in_RDI);
      }
      local_4f8 = (QString *)
                  ((long)&((totally_ordered_wrapper<QSqlRecordPrivate_*> *)&(local_4f8->d).d)->ptr +
                  1);
    }
    QVar10 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    uVar5 = QString::endsWith((QLatin1String *)in_RDI,(CaseSensitivity)QVar10.m_size);
    if ((uVar5 & 1) == 0) {
      QString::clear((QString *)in_stack_fffffffffffffa50);
    }
    else {
      QString::chop((longlong)in_RDI);
    }
    break;
  case 3:
    local_3d8 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QString *)in_stack_fffffffffffffa50,(QLatin1String *)in_stack_fffffffffffffa48);
    ::operator+((QStringBuilder<QString_&,_QLatin1String> *)in_stack_fffffffffffffa50,
                (QString *)in_stack_fffffffffffffa48);
    local_3e8 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&> *)
                in_stack_fffffffffffffa50,(QLatin1String *)in_stack_fffffffffffffa48);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffa48);
    QString::operator=((QString *)in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
    QString::~QString((QString *)0x12dcf5);
    local_400 = 0xaaaaaaaaaaaaaaaa;
    local_3f8 = 0xaaaaaaaaaaaaaaaa;
    local_3f0 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x12dd2f);
    local_520 = (QSqlDriver *)0x0;
    while (driver = local_520, iVar3 = QSqlRecord::count((QSqlRecord *)0x12dd55),
          (long)driver < (long)iVar3) {
      bVar2 = QSqlRecord::isGenerated
                        ((QSqlRecord *)in_stack_fffffffffffffa50,
                         (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      if (bVar2) {
        QSqlRecord::fieldName
                  ((QSqlRecord *)in_stack_fffffffffffffa68,
                   (int)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        prepareIdentifier(in_stack_fffffffffffffa68,
                          (IdentifierType)((ulong)in_stack_fffffffffffffa60 >> 0x20),driver);
        in_stack_fffffffffffffa50 =
             (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String> *)
             QString::append((QString *)in_RDI);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)driver,(size_t)in_stack_fffffffffffffa50);
        QString::append((QLatin1String *)in_stack_fffffffffffffa50);
        QString::~QString((QString *)0x12de22);
        QString::~QString((QString *)0x12de2f);
        if (bVar1 == 0) {
          QSqlRecord::field((QSqlRecord *)driver,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20));
          (**(code **)(*in_RSI + 0x98))(local_450,in_RSI,local_80,0);
          QString::append((QString *)&local_400);
          QString::~QString((QString *)0x12dec3);
          QSqlField::~QSqlField((QSqlField *)in_stack_fffffffffffffa50);
        }
        else {
          QChar::QChar<char16_t,_true>(local_432,L'?');
          QString::append((QChar *)&local_400);
        }
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)driver,(size_t)in_stack_fffffffffffffa50);
        QString::append((QLatin1String *)&local_400);
      }
      local_520 = (QSqlDriver *)&local_520->field_0x1;
    }
    bVar2 = QString::isEmpty((QString *)0x12df2e);
    if (bVar2) {
      QString::clear((QString *)in_stack_fffffffffffffa50);
    }
    else {
      QString::chop((longlong)&local_400);
      QChar::QChar<char16_t,_true>(&local_452,L')');
      QString::size(in_RDI);
      pQVar6 = QString::operator[]((QString *)in_stack_fffffffffffffa48,0x12df82);
      pQVar6->ucs = local_452.ucs;
      Qt::Literals::StringLiterals::operator____L1((char *)driver,(size_t)in_stack_fffffffffffffa50)
      ;
      pQVar7 = (QString *)QString::append((QLatin1String *)in_RDI);
      pQVar8 = (QChar *)QString::append(pQVar7);
      QChar::QChar<char16_t,_true>(&local_454,L')');
      QString::append(pQVar8);
    }
    QString::~QString((QString *)0x12e00b);
    break;
  case 4:
    local_348 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffa58,(size_t)in_stack_fffffffffffffa50);
    ::operator+((QString *)in_stack_fffffffffffffa50,(QLatin1String *)in_stack_fffffffffffffa48);
    ::operator+((QStringBuilder<QString_&,_QLatin1String> *)in_stack_fffffffffffffa50,
                (QString *)in_stack_fffffffffffffa48);
    ::QStringBuilder::operator_cast_to_QString(&in_stack_fffffffffffffa48->a);
    QString::operator=((QString *)in_stack_fffffffffffffa50,(QString *)in_stack_fffffffffffffa48);
    QString::~QString((QString *)0x12dc26);
  }
  QString::~QString((QString *)0x12e03f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlDriver::sqlStatement(StatementType type, const QString &tableName,
                                 const QSqlRecord &rec, bool preparedStatement) const
{
    const auto tableNameString = tableName.isEmpty() ? QString()
                                    : prepareIdentifier(tableName, QSqlDriver::TableName, this);
    QString s;
    s.reserve(128);
    switch (type) {
    case SelectStatement:
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (rec.isGenerated(i))
                s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
        }
        if (s.isEmpty())
            return s;
        s.chop(2);
        s = "SELECT "_L1 + s + " FROM "_L1 + tableNameString;
        break;
    case WhereStatement:
    {
        const QString tableNamePrefix = tableNameString.isEmpty()
                                            ? QString() : tableNameString + u'.';
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(s.isEmpty() ? "WHERE "_L1 : " AND "_L1);
            s.append(tableNamePrefix);
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this));
            if (rec.isNull(i))
                s.append(" IS NULL"_L1);
            else if (preparedStatement)
                s.append(" = ?"_L1);
            else
                s.append(" = "_L1).append(formatValue(rec.field(i)));
        }
        break;
    }
    case UpdateStatement:
        s = s + "UPDATE "_L1 + tableNameString + " SET "_L1;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(u'=');
            if (preparedStatement)
                s.append(u'?');
            else
                s.append(formatValue(rec.field(i)));
            s.append(", "_L1);
        }
        if (s.endsWith(", "_L1))
            s.chop(2);
        else
            s.clear();
        break;
    case DeleteStatement:
        s = s + "DELETE FROM "_L1 + tableNameString;
        break;
    case InsertStatement: {
        s = s + "INSERT INTO "_L1 + tableNameString + " ("_L1;
        QString vals;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
            if (preparedStatement)
                vals.append(u'?');
            else
                vals.append(formatValue(rec.field(i)));
            vals.append(", "_L1);
        }
        if (vals.isEmpty()) {
            s.clear();
        } else {
            vals.chop(2); // remove trailing comma
            s[s.size() - 2] = u')';
            s.append("VALUES ("_L1).append(vals).append(u')');
        }
        break; }
    }
    return s;
}